

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGLDriver::setBasicRenderStates
          (COpenGLDriver *this,SMaterial *material,SMaterial *lastmaterial,bool resetAllRenderStates
          )

{
  bool bVar1;
  u32 uVar2;
  uint uVar3;
  GLenum GVar4;
  byte in_CL;
  long in_RDX;
  long in_RSI;
  COpenGLDriver *in_RDI;
  u32 alphaSource;
  E_MODULATE_FUNC modulo;
  E_BLEND_FACTOR dstAlphaFact;
  E_BLEND_FACTOR srcAlphaFact;
  E_BLEND_FACTOR dstRGBFact;
  E_BLEND_FACTOR srcRGBFact;
  f32 inv_1;
  GLfloat color_1 [4];
  f32 inv;
  GLfloat color [4];
  E_OPENGL_FIXED_PIPELINE_STATE tempState;
  undefined4 in_stack_ffffffffffffff08;
  GLenum in_stack_ffffffffffffff0c;
  bool enable;
  GLenum in_stack_ffffffffffffff10;
  GLenum in_stack_ffffffffffffff14;
  E_BLEND_FACTOR *in_stack_ffffffffffffff18;
  COpenGLCacheHandler *pCVar5;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  CNullDriver *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 local_ac;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  E_OPENGL_FIXED_PIPELINE_STATE local_20;
  byte local_19;
  long local_18;
  long local_10;
  
  local_19 = in_CL & 1;
  local_20 = in_RDI->FixedPipelineState;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (((local_19 == 0) && (local_20 != EOFPS_ENABLE)) && (local_20 != EOFPS_DISABLE_TO_ENABLE)) {
    if (local_20 == EOFPS_ENABLE_TO_DISABLE) {
      glDisable(0xb57);
      glDisable(0xb50);
      glDisable(0xb60);
      glDisable(0xba1);
      local_20 = EOFPS_DISABLE;
    }
  }
  else {
    if (((local_19 != 0) || (local_20 == EOFPS_DISABLE_TO_ENABLE)) ||
       (((byte)(*(ushort *)(in_RDX + 0xa2) >> 4) & 7) !=
        ((byte)(*(ushort *)(in_RSI + 0xa2) >> 4) & 7))) {
      switch(*(ushort *)(in_RSI + 0xa2) >> 4 & 7) {
      case 0:
        glDisable(0xb57);
        break;
      case 1:
        glColorMaterial(0x408,0x1201);
        break;
      case 2:
        glColorMaterial(0x408,0x1200);
        break;
      case 3:
        glColorMaterial(0x408,0x1600);
        break;
      case 4:
        glColorMaterial(0x408,0x1202);
        break;
      case 5:
        glColorMaterial(0x408,0x1602);
      }
      if ((*(ushort *)(local_10 + 0xa2) >> 4 & 7) != 0) {
        glEnable(0xb57);
      }
    }
    if ((((local_19 & 1) != 0) || (local_20 == EOFPS_DISABLE_TO_ENABLE)) ||
       ((bVar1 = SColor::operator!=((SColor *)(local_18 + 0x84),(SColor *)(local_10 + 0x84)), bVar1
        || (((bVar1 = SColor::operator!=((SColor *)(local_18 + 0x88),(SColor *)(local_10 + 0x88)),
             bVar1 || (bVar1 = SColor::operator!=((SColor *)(local_18 + 0x8c),
                                                  (SColor *)(local_10 + 0x8c)), bVar1)) ||
            (((byte)(*(ushort *)(local_18 + 0xa2) >> 4) & 7) !=
             ((byte)(*(ushort *)(local_10 + 0xa2) >> 4) & 7))))))) {
      local_3c = 0x3b808081;
      if ((((byte)(*(ushort *)(local_10 + 0xa2) >> 4) & 7) != 2) &&
         (((byte)(*(ushort *)(local_10 + 0xa2) >> 4) & 7) != 5)) {
        uVar2 = SColor::getRed((SColor *)(local_10 + 0x84));
        local_38 = (float)uVar2 * 0.003921569;
        uVar2 = SColor::getGreen((SColor *)(local_10 + 0x84));
        local_34 = (float)uVar2 * 0.003921569;
        uVar2 = SColor::getBlue((SColor *)(local_10 + 0x84));
        local_30 = (float)uVar2 * 0.003921569;
        uVar2 = SColor::getAlpha((SColor *)(local_10 + 0x84));
        local_2c = (float)uVar2 * 0.003921569;
        glMaterialfv(0x408,0x1200,&local_38);
      }
      if ((((byte)(*(ushort *)(local_10 + 0xa2) >> 4) & 7) != 1) &&
         (((byte)(*(ushort *)(local_10 + 0xa2) >> 4) & 7) != 5)) {
        uVar2 = SColor::getRed((SColor *)(local_10 + 0x88));
        local_38 = (float)uVar2 * 0.003921569;
        uVar2 = SColor::getGreen((SColor *)(local_10 + 0x88));
        local_34 = (float)uVar2 * 0.003921569;
        uVar2 = SColor::getBlue((SColor *)(local_10 + 0x88));
        local_30 = (float)uVar2 * 0.003921569;
        uVar2 = SColor::getAlpha((SColor *)(local_10 + 0x88));
        local_2c = (float)uVar2 * 0.003921569;
        glMaterialfv(0x408,0x1201,&local_38);
      }
      if (((byte)(*(ushort *)(local_10 + 0xa2) >> 4) & 7) != 3) {
        uVar2 = SColor::getRed((SColor *)(local_10 + 0x8c));
        local_38 = (float)uVar2 * 0.003921569;
        uVar2 = SColor::getGreen((SColor *)(local_10 + 0x8c));
        local_34 = (float)uVar2 * 0.003921569;
        uVar2 = SColor::getBlue((SColor *)(local_10 + 0x8c));
        local_30 = (float)uVar2 * 0.003921569;
        uVar2 = SColor::getAlpha((SColor *)(local_10 + 0x8c));
        local_2c = (float)uVar2 * 0.003921569;
        glMaterialfv(0x408,0x1600,&local_38);
      }
    }
    if ((((((local_19 & 1) != 0) || (local_20 == EOFPS_DISABLE_TO_ENABLE)) ||
         (bVar1 = SColor::operator!=((SColor *)(local_18 + 0x90),(SColor *)(local_10 + 0x90)), bVar1
         )) || ((*(float *)(local_18 + 0x94) != *(float *)(local_10 + 0x94) ||
                (NAN(*(float *)(local_18 + 0x94)) || NAN(*(float *)(local_10 + 0x94)))))) ||
       (((byte)(*(ushort *)(local_18 + 0xa2) >> 4) & 7) !=
        ((byte)(*(ushort *)(local_10 + 0xa2) >> 4) & 7))) {
      local_58 = 0;
      local_50 = 0x3f80000000000000;
      glMaterialf(*(undefined4 *)(local_10 + 0x94),0x408,0x1601);
      if (((*(float *)(local_10 + 0x94) == 0.0) && (!NAN(*(float *)(local_10 + 0x94)))) ||
         (((byte)(*(ushort *)(local_10 + 0xa2) >> 4) & 7) == 4)) {
        if ((in_RDI->field_0x5d7 & 1) != 0) {
          glLightModeli(0x81f8,0x81f9);
        }
      }
      else {
        if ((in_RDI->field_0x5d7 & 1) != 0) {
          glLightModeli(0x81f8,0x81fa);
        }
        uVar2 = SColor::getRed((SColor *)(local_10 + 0x90));
        local_58 = CONCAT44(local_58._4_4_,(float)uVar2 * 0.003921569);
        uVar2 = SColor::getGreen((SColor *)(local_10 + 0x90));
        local_58 = CONCAT44((float)uVar2 * 0.003921569,(undefined4)local_58);
        uVar2 = SColor::getBlue((SColor *)(local_10 + 0x90));
        local_50 = CONCAT44(local_50._4_4_,(float)uVar2 * 0.003921569);
        uVar2 = SColor::getAlpha((SColor *)(local_10 + 0x90));
        local_50 = CONCAT44((float)uVar2 * 0.003921569,(undefined4)local_50);
      }
      glMaterialfv(0x408,0x1202,&local_58);
    }
    if ((((local_19 & 1) != 0) || (local_20 == EOFPS_DISABLE_TO_ENABLE)) ||
       (((byte)(*(ushort *)(local_18 + 0xb0) >> 2) & 1) !=
        ((byte)(*(ushort *)(local_10 + 0xb0) >> 2) & 1))) {
      if ((*(ushort *)(local_10 + 0xb0) >> 2 & 1) == 0) {
        glShadeModel(0x1d00);
      }
      else {
        glShadeModel(0x1d01);
      }
    }
    if ((((local_19 & 1) != 0) || (local_20 == EOFPS_DISABLE_TO_ENABLE)) ||
       (((byte)(*(ushort *)(local_18 + 0xb0) >> 3) & 1) !=
        ((byte)(*(ushort *)(local_10 + 0xb0) >> 3) & 1))) {
      if ((*(ushort *)(local_10 + 0xb0) >> 3 & 1) == 0) {
        glDisable(0xb50);
      }
      else {
        glEnable(0xb50);
      }
    }
    if ((((local_19 & 1) != 0) || (local_20 == EOFPS_DISABLE_TO_ENABLE)) ||
       (((byte)((ushort)*(undefined2 *)(local_18 + 0xb0) >> 8) & 1) !=
        ((byte)((ushort)*(undefined2 *)(local_10 + 0xb0) >> 8) & 1))) {
      if ((*(ushort *)(local_10 + 0xb0) >> 8 & 1) == 0) {
        glDisable(0xb60);
      }
      else {
        glEnable(0xb60);
      }
    }
    if ((((local_19 & 1) != 0) || (local_20 == EOFPS_DISABLE_TO_ENABLE)) ||
       (((byte)((ushort)*(undefined2 *)(local_18 + 0xb0) >> 9) & 1) !=
        ((byte)((ushort)*(undefined2 *)(local_10 + 0xb0) >> 9) & 1))) {
      if ((*(ushort *)(local_10 + 0xb0) >> 9 & 1) == 0) {
        glDisable(0xba1);
      }
      else {
        glEnable(0xba1);
      }
    }
    local_20 = EOFPS_ENABLE;
  }
  if ((((local_19 & 1) != 0) ||
      (((byte)*(undefined2 *)(local_18 + 0xb0) & 1) != ((byte)*(undefined2 *)(local_10 + 0xb0) & 1))
      ) || (((byte)(*(ushort *)(local_18 + 0xb0) >> 1) & 1) !=
            ((byte)(*(ushort *)(local_10 + 0xb0) >> 1) & 1))) {
    if ((*(ushort *)(local_10 + 0xb0) & 1) == 0) {
      local_ac = 0x1b02;
      if ((*(ushort *)(local_10 + 0xb0) >> 1 & 1) != 0) {
        local_ac = 0x1b00;
      }
    }
    else {
      local_ac = 0x1b01;
    }
    glPolygonMode(0x408,local_ac);
  }
  bVar1 = SUB41(in_stack_ffffffffffffff0c >> 0x18,0);
  switch(*(undefined1 *)(local_10 + 0xa0)) {
  case 0:
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthTest((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),bVar1);
    break;
  case 1:
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthTest((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),bVar1);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthFunc((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff0c);
    break;
  case 2:
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthTest((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),bVar1);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthFunc((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff0c);
    break;
  case 3:
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthTest((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),bVar1);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthFunc((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff0c);
    break;
  case 4:
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthTest((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),bVar1);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthFunc((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff0c);
    break;
  case 5:
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthTest((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),bVar1);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthFunc((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff0c);
    break;
  case 6:
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthTest((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),bVar1);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthFunc((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff0c);
    break;
  case 7:
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthTest((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),bVar1);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthFunc((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff0c);
    break;
  case 8:
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthTest((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),bVar1);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthFunc((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff0c);
  }
  bVar1 = CNullDriver::getWriteZBuffer
                    (in_stack_ffffffffffffff28,
                     (SMaterial *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  enable = SUB41(in_stack_ffffffffffffff0c >> 0x18,0);
  if (bVar1) {
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthMask((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),enable);
  }
  else {
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setDepthMask((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),enable);
  }
  if (((*(ushort *)(local_10 + 0xb0) >> 7 & 1) == 0) ||
     ((*(ushort *)(local_10 + 0xb0) >> 6 & 1) == 0)) {
    if ((*(ushort *)(local_10 + 0xb0) >> 6 & 1) == 0) {
      if ((*(ushort *)(local_10 + 0xb0) >> 7 & 1) == 0) {
        COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ::setCullFace((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                       *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      SUB41(in_stack_ffffffffffffff0c >> 0x18,0));
      }
      else {
        COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ::setCullFaceFunc((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                           *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          in_stack_ffffffffffffff0c);
        COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ::setCullFace((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                       *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      SUB41(in_stack_ffffffffffffff0c >> 0x18,0));
      }
    }
    else {
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::setCullFaceFunc((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                         *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        in_stack_ffffffffffffff0c);
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::setCullFace((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                     *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                    SUB41(in_stack_ffffffffffffff0c >> 0x18,0));
    }
  }
  else {
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setCullFaceFunc((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                       *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      in_stack_ffffffffffffff0c);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setCullFace((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                   *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                  SUB41(in_stack_ffffffffffffff0c >> 0x18,0));
  }
  COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  ::setColorMask((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                  *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (u8)(in_stack_ffffffffffffff0c >> 0x18));
  bVar1 = SUB41(in_stack_ffffffffffffff0c >> 0x18,0);
  if ((*(ushort *)(local_10 + 0xa2) >> 7 & 0xf) == 0) {
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setBlend((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),bVar1);
  }
  else {
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setBlend((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),bVar1);
    uVar3 = (*(in_RDI->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[2])(in_RDI,0x21);
    if ((uVar3 & 1) != 0) {
      switch(*(ushort *)(local_10 + 0xa2) >> 7 & 0xf) {
      case 2:
        COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ::setBlendEquation((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                            *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        break;
      case 3:
        COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ::setBlendEquation((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                            *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        break;
      case 4:
        COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ::setBlendEquation((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                            *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        break;
      case 5:
        COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ::setBlendEquation((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                            *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        break;
      case 6:
        if ((in_RDI->field_0x4d9 & 1) == 0) {
          COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ::setBlendEquation((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                              *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             in_stack_ffffffffffffff0c);
        }
        else {
          COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ::setBlendEquation((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                              *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             in_stack_ffffffffffffff0c);
        }
        break;
      case 7:
        if ((in_RDI->field_0x4d9 & 1) == 0) {
          COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ::setBlendEquation((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                              *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             in_stack_ffffffffffffff0c);
        }
        else {
          COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ::setBlendEquation((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                              *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             in_stack_ffffffffffffff0c);
        }
        break;
      case 8:
        if ((in_RDI->field_0x687 & 1) == 0) {
          if ((in_RDI->field_0x5a7 & 1) != 0) {
            COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
            ::setBlendEquation((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                                *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                               in_stack_ffffffffffffff0c);
          }
        }
        else {
          COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ::setBlendEquation((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                              *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             in_stack_ffffffffffffff0c);
        }
        break;
      case 9:
        if ((in_RDI->field_0x687 & 1) == 0) {
          if ((in_RDI->field_0x5a7 & 1) != 0) {
            COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
            ::setBlendEquation((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                                *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                               in_stack_ffffffffffffff0c);
          }
        }
        else {
          COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ::setBlendEquation((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                              *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             in_stack_ffffffffffffff0c);
        }
        break;
      default:
        COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ::setBlendEquation((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                            *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
      }
    }
  }
  uVar2 = core::IR(*(f32 *)(local_10 + 0xa4));
  if ((uVar2 != 0) && (*(int *)(local_10 + 0x80) != 4)) {
    unpack_textureBlendFuncSeparate
              ((E_BLEND_FACTOR *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (E_BLEND_FACTOR *)in_stack_ffffffffffffff28,
               (E_BLEND_FACTOR *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18,
               (E_MODULATE_FUNC *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (u32 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0.0);
    uVar3 = (*(in_RDI->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[2])(in_RDI,0x22);
    if ((uVar3 & 1) == 0) {
      pCVar5 = in_RDI->CacheHandler;
      GVar4 = getGLBlend(in_RDI,EBF_ZERO);
      getGLBlend(in_RDI,EBF_ZERO);
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::setBlendFunc((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                      *)CONCAT44(GVar4,in_stack_ffffffffffffff20),(GLenum)((ulong)pCVar5 >> 0x20),
                     (GLenum)pCVar5);
    }
    else {
      getGLBlend(in_RDI,EBF_ZERO);
      getGLBlend(in_RDI,EBF_ZERO);
      getGLBlend(in_RDI,EBF_ZERO);
      getGLBlend(in_RDI,EBF_ZERO);
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::setBlendFuncSeparate
                ((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                  *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (GLenum)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 (GLenum)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                 in_stack_ffffffffffffff10);
    }
  }
  uVar3 = (*(in_RDI->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[2])(in_RDI,0x20);
  if (((uVar3 & 1) != 0) &&
     (((((local_19 & 1) != 0 || (*(float *)(local_18 + 0xac) != *(float *)(local_10 + 0xac))) ||
       (NAN(*(float *)(local_18 + 0xac)) || NAN(*(float *)(local_10 + 0xac)))) ||
      ((*(float *)(local_18 + 0xa8) != *(float *)(local_10 + 0xa8) ||
       (NAN(*(float *)(local_18 + 0xa8)) || NAN(*(float *)(local_10 + 0xa8)))))))) {
    if ((*(ushort *)(local_18 + 0xb0) & 1) == 0) {
      in_stack_ffffffffffffff14 = 0x8037;
      if ((*(ushort *)(local_18 + 0xb0) >> 1 & 1) != 0) {
        in_stack_ffffffffffffff14 = 0x2a01;
      }
    }
    else {
      in_stack_ffffffffffffff14 = 0x2a02;
    }
    glDisable(in_stack_ffffffffffffff14);
    if (((*(float *)(local_10 + 0xac) != 0.0) || (NAN(*(float *)(local_10 + 0xac)))) ||
       ((*(float *)(local_10 + 0xa8) != 0.0 || (NAN(*(float *)(local_10 + 0xa8)))))) {
      if ((*(ushort *)(local_10 + 0xb0) & 1) == 0) {
        in_stack_ffffffffffffff10 = 0x8037;
        if ((*(ushort *)(local_10 + 0xb0) >> 1 & 1) != 0) {
          in_stack_ffffffffffffff10 = 0x2a01;
        }
      }
      else {
        in_stack_ffffffffffffff10 = 0x2a02;
      }
      glEnable(in_stack_ffffffffffffff10);
      glPolygonOffset(*(undefined4 *)(local_10 + 0xac),*(undefined4 *)(local_10 + 0xa8));
    }
    else {
      glPolygonOffset(0);
    }
  }
  if ((local_19 & 1) == 0) {
    if ((*(float *)(local_18 + 0x9c) == *(float *)(local_10 + 0x9c)) &&
       (!NAN(*(float *)(local_18 + 0x9c)) && !NAN(*(float *)(local_10 + 0x9c)))) goto LAB_003406b5;
  }
  if (in_RDI->AntiAlias == '\0') {
    core::clamp<float>((float *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (float *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       (float *)0x340667);
    glPointSize();
    core::clamp<float>((float *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (float *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       (float *)0x3406ae);
    glLineWidth();
  }
  else {
    core::clamp<float>((float *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (float *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       (float *)0x3405d4);
    glPointSize();
    core::clamp<float>((float *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (float *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       (float *)0x34061b);
    glLineWidth();
  }
LAB_003406b5:
  if ((((local_19 & 1) != 0) || (*(char *)(local_18 + 0xa1) != *(char *)(local_10 + 0xa1))) &&
     ((in_RDI->field_0x538 & 1) != 0)) {
    if ((*(byte *)(local_10 + 0xa1) & 4) == 0) {
      if ((*(byte *)(local_18 + 0xa1) & 4) != 0) {
        glDisable(0x809e);
      }
    }
    else {
      glEnable(0x809e);
    }
    if ((in_RDI->AntiAlias < 2) || ((*(byte *)(local_10 + 0xa1) & 3) == 0)) {
      glDisable(0x809d);
    }
    else {
      glEnable(0x809d);
      if ((in_RDI->field_0x63a & 1) != 0) {
        if ((*(byte *)(local_10 + 0xa1) & 3) == 3) {
          glHint(0x8534,0x1102);
        }
        else {
          glHint(0x8534,0x1101);
        }
      }
    }
  }
  (*(in_RDI->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x79])
            (in_RDI,local_10,(ulong)local_19 & 1);
  in_RDI->FixedPipelineState = local_20;
  return;
}

Assistant:

void COpenGLDriver::setBasicRenderStates(const SMaterial &material, const SMaterial &lastmaterial,
		bool resetAllRenderStates)
{
	// Fixed pipeline isn't important for shader based materials

	E_OPENGL_FIXED_PIPELINE_STATE tempState = FixedPipelineState;

	if (resetAllRenderStates || tempState == EOFPS_ENABLE || tempState == EOFPS_DISABLE_TO_ENABLE) {
		// material colors
		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.ColorMaterial != material.ColorMaterial) {
			switch (material.ColorMaterial) {
			case ECM_NONE:
				glDisable(GL_COLOR_MATERIAL);
				break;
			case ECM_DIFFUSE:
				glColorMaterial(GL_FRONT_AND_BACK, GL_DIFFUSE);
				break;
			case ECM_AMBIENT:
				glColorMaterial(GL_FRONT_AND_BACK, GL_AMBIENT);
				break;
			case ECM_EMISSIVE:
				glColorMaterial(GL_FRONT_AND_BACK, GL_EMISSION);
				break;
			case ECM_SPECULAR:
				glColorMaterial(GL_FRONT_AND_BACK, GL_SPECULAR);
				break;
			case ECM_DIFFUSE_AND_AMBIENT:
				glColorMaterial(GL_FRONT_AND_BACK, GL_AMBIENT_AND_DIFFUSE);
				break;
			}
			if (material.ColorMaterial != ECM_NONE)
				glEnable(GL_COLOR_MATERIAL);
		}

		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.AmbientColor != material.AmbientColor ||
				lastmaterial.DiffuseColor != material.DiffuseColor ||
				lastmaterial.EmissiveColor != material.EmissiveColor ||
				lastmaterial.ColorMaterial != material.ColorMaterial) {
			GLfloat color[4];

			const f32 inv = 1.0f / 255.0f;

			if ((material.ColorMaterial != video::ECM_AMBIENT) &&
					(material.ColorMaterial != video::ECM_DIFFUSE_AND_AMBIENT)) {
				color[0] = material.AmbientColor.getRed() * inv;
				color[1] = material.AmbientColor.getGreen() * inv;
				color[2] = material.AmbientColor.getBlue() * inv;
				color[3] = material.AmbientColor.getAlpha() * inv;
				glMaterialfv(GL_FRONT_AND_BACK, GL_AMBIENT, color);
			}

			if ((material.ColorMaterial != video::ECM_DIFFUSE) &&
					(material.ColorMaterial != video::ECM_DIFFUSE_AND_AMBIENT)) {
				color[0] = material.DiffuseColor.getRed() * inv;
				color[1] = material.DiffuseColor.getGreen() * inv;
				color[2] = material.DiffuseColor.getBlue() * inv;
				color[3] = material.DiffuseColor.getAlpha() * inv;
				glMaterialfv(GL_FRONT_AND_BACK, GL_DIFFUSE, color);
			}

			if (material.ColorMaterial != video::ECM_EMISSIVE) {
				color[0] = material.EmissiveColor.getRed() * inv;
				color[1] = material.EmissiveColor.getGreen() * inv;
				color[2] = material.EmissiveColor.getBlue() * inv;
				color[3] = material.EmissiveColor.getAlpha() * inv;
				glMaterialfv(GL_FRONT_AND_BACK, GL_EMISSION, color);
			}
		}

		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.SpecularColor != material.SpecularColor ||
				lastmaterial.Shininess != material.Shininess ||
				lastmaterial.ColorMaterial != material.ColorMaterial) {
			GLfloat color[4] = {0.f, 0.f, 0.f, 1.f};
			const f32 inv = 1.0f / 255.0f;

			glMaterialf(GL_FRONT_AND_BACK, GL_SHININESS, material.Shininess);
			// disable Specular colors if no shininess is set
			if ((material.Shininess != 0.0f) &&
					(material.ColorMaterial != video::ECM_SPECULAR)) {
#ifdef GL_EXT_separate_specular_color
				if (FeatureAvailable[IRR_EXT_separate_specular_color])
					glLightModeli(GL_LIGHT_MODEL_COLOR_CONTROL, GL_SEPARATE_SPECULAR_COLOR);
#endif
				color[0] = material.SpecularColor.getRed() * inv;
				color[1] = material.SpecularColor.getGreen() * inv;
				color[2] = material.SpecularColor.getBlue() * inv;
				color[3] = material.SpecularColor.getAlpha() * inv;
			}
#ifdef GL_EXT_separate_specular_color
			else if (FeatureAvailable[IRR_EXT_separate_specular_color])
				glLightModeli(GL_LIGHT_MODEL_COLOR_CONTROL, GL_SINGLE_COLOR);
#endif
			glMaterialfv(GL_FRONT_AND_BACK, GL_SPECULAR, color);
		}

		// shademode
		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.GouraudShading != material.GouraudShading) {
			if (material.GouraudShading)
				glShadeModel(GL_SMOOTH);
			else
				glShadeModel(GL_FLAT);
		}

		// lighting
		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.Lighting != material.Lighting) {
			if (material.Lighting)
				glEnable(GL_LIGHTING);
			else
				glDisable(GL_LIGHTING);
		}

		// fog
		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.FogEnable != material.FogEnable) {
			if (material.FogEnable)
				glEnable(GL_FOG);
			else
				glDisable(GL_FOG);
		}

		// normalization
		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.NormalizeNormals != material.NormalizeNormals) {
			if (material.NormalizeNormals)
				glEnable(GL_NORMALIZE);
			else
				glDisable(GL_NORMALIZE);
		}

		// Set fixed pipeline as active.
		tempState = EOFPS_ENABLE;
	} else if (tempState == EOFPS_ENABLE_TO_DISABLE) {
		glDisable(GL_COLOR_MATERIAL);
		glDisable(GL_LIGHTING);
		glDisable(GL_FOG);
		glDisable(GL_NORMALIZE);

		// Set programmable pipeline as active.
		tempState = EOFPS_DISABLE;
	}

	// tempState == EOFPS_DISABLE - driver doesn't calls functions related to fixed pipeline.

	// fillmode - fixed pipeline call, but it emulate GL_LINES behaviour in rendering, so it stay here.
	if (resetAllRenderStates || (lastmaterial.Wireframe != material.Wireframe) || (lastmaterial.PointCloud != material.PointCloud))
		glPolygonMode(GL_FRONT_AND_BACK, material.Wireframe ? GL_LINE : material.PointCloud ? GL_POINT
																							: GL_FILL);

	// ZBuffer
	switch (material.ZBuffer) {
	case ECFN_DISABLED:
		CacheHandler->setDepthTest(false);
		break;
	case ECFN_LESSEQUAL:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_LEQUAL);
		break;
	case ECFN_EQUAL:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_EQUAL);
		break;
	case ECFN_LESS:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_LESS);
		break;
	case ECFN_NOTEQUAL:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_NOTEQUAL);
		break;
	case ECFN_GREATEREQUAL:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_GEQUAL);
		break;
	case ECFN_GREATER:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_GREATER);
		break;
	case ECFN_ALWAYS:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_ALWAYS);
		break;
	case ECFN_NEVER:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_NEVER);
		break;
	default:
		break;
	}

	// ZWrite
	if (getWriteZBuffer(material)) {
		CacheHandler->setDepthMask(true);
	} else {
		CacheHandler->setDepthMask(false);
	}

	// Back face culling
	if ((material.FrontfaceCulling) && (material.BackfaceCulling)) {
		CacheHandler->setCullFaceFunc(GL_FRONT_AND_BACK);
		CacheHandler->setCullFace(true);
	} else if (material.BackfaceCulling) {
		CacheHandler->setCullFaceFunc(GL_BACK);
		CacheHandler->setCullFace(true);
	} else if (material.FrontfaceCulling) {
		CacheHandler->setCullFaceFunc(GL_FRONT);
		CacheHandler->setCullFace(true);
	} else {
		CacheHandler->setCullFace(false);
	}

	// Color Mask
	CacheHandler->setColorMask(material.ColorMask);

	// Blend Equation
	if (material.BlendOperation == EBO_NONE)
		CacheHandler->setBlend(false);
	else {
		CacheHandler->setBlend(true);

#if defined(GL_EXT_blend_subtract) || defined(GL_EXT_blend_minmax) || defined(GL_EXT_blend_logic_op) || defined(GL_VERSION_1_4)
		if (queryFeature(EVDF_BLEND_OPERATIONS)) {
			switch (material.BlendOperation) {
			case EBO_SUBTRACT:
#if defined(GL_VERSION_1_4)
				CacheHandler->setBlendEquation(GL_FUNC_SUBTRACT);
#elif defined(GL_EXT_blend_subtract)
				CacheHandler->setBlendEquation(GL_FUNC_SUBTRACT_EXT);
#endif
				break;
			case EBO_REVSUBTRACT:
#if defined(GL_VERSION_1_4)
				CacheHandler->setBlendEquation(GL_FUNC_REVERSE_SUBTRACT);
#elif defined(GL_EXT_blend_subtract)
				CacheHandler->setBlendEquation(GL_FUNC_REVERSE_SUBTRACT_EXT);
#endif
				break;
			case EBO_MIN:
#if defined(GL_VERSION_1_4)
				CacheHandler->setBlendEquation(GL_MIN);
#elif defined(GL_EXT_blend_minmax)
				CacheHandler->setBlendEquation(GL_MIN_EXT);
#endif
				break;
			case EBO_MAX:
#if defined(GL_VERSION_1_4)
				CacheHandler->setBlendEquation(GL_MAX);
#elif defined(GL_EXT_blend_minmax)
				CacheHandler->setBlendEquation(GL_MAX_EXT);
#endif
				break;
			case EBO_MIN_FACTOR:
#if defined(GL_AMD_blend_minmax_factor)
				if (FeatureAvailable[IRR_AMD_blend_minmax_factor])
					CacheHandler->setBlendEquation(GL_FACTOR_MIN_AMD);
#endif
					// fallback in case of missing extension
#if defined(GL_VERSION_1_4)
#if defined(GL_AMD_blend_minmax_factor)
				else
#endif
					CacheHandler->setBlendEquation(GL_MIN);
#endif
				break;
			case EBO_MAX_FACTOR:
#if defined(GL_AMD_blend_minmax_factor)
				if (FeatureAvailable[IRR_AMD_blend_minmax_factor])
					CacheHandler->setBlendEquation(GL_FACTOR_MAX_AMD);
#endif
					// fallback in case of missing extension
#if defined(GL_VERSION_1_4)
#if defined(GL_AMD_blend_minmax_factor)
				else
#endif
					CacheHandler->setBlendEquation(GL_MAX);
#endif
				break;
			case EBO_MIN_ALPHA:
#if defined(GL_SGIX_blend_alpha_minmax)
				if (FeatureAvailable[IRR_SGIX_blend_alpha_minmax])
					CacheHandler->setBlendEquation(GL_ALPHA_MIN_SGIX);
				// fallback in case of missing extension
				else if (FeatureAvailable[IRR_EXT_blend_minmax])
					CacheHandler->setBlendEquation(GL_MIN_EXT);
#endif
				break;
			case EBO_MAX_ALPHA:
#if defined(GL_SGIX_blend_alpha_minmax)
				if (FeatureAvailable[IRR_SGIX_blend_alpha_minmax])
					CacheHandler->setBlendEquation(GL_ALPHA_MAX_SGIX);
				// fallback in case of missing extension
				else if (FeatureAvailable[IRR_EXT_blend_minmax])
					CacheHandler->setBlendEquation(GL_MAX_EXT);
#endif
				break;
			default:
#if defined(GL_VERSION_1_4)
				CacheHandler->setBlendEquation(GL_FUNC_ADD);
#elif defined(GL_EXT_blend_subtract) || defined(GL_EXT_blend_minmax) || defined(GL_EXT_blend_logic_op)
				CacheHandler->setBlendEquation(GL_FUNC_ADD_EXT);
#endif
				break;
			}
		}
#endif
	}

	// Blend Factor
	if (IR(material.BlendFactor) & 0xFFFFFFFF // TODO: why the & 0xFFFFFFFF?
			&& material.MaterialType != EMT_ONETEXTURE_BLEND) {
		E_BLEND_FACTOR srcRGBFact = EBF_ZERO;
		E_BLEND_FACTOR dstRGBFact = EBF_ZERO;
		E_BLEND_FACTOR srcAlphaFact = EBF_ZERO;
		E_BLEND_FACTOR dstAlphaFact = EBF_ZERO;
		E_MODULATE_FUNC modulo = EMFN_MODULATE_1X;
		u32 alphaSource = 0;

		unpack_textureBlendFuncSeparate(srcRGBFact, dstRGBFact, srcAlphaFact, dstAlphaFact, modulo, alphaSource, material.BlendFactor);

		if (queryFeature(EVDF_BLEND_SEPARATE)) {
			CacheHandler->setBlendFuncSeparate(getGLBlend(srcRGBFact), getGLBlend(dstRGBFact),
					getGLBlend(srcAlphaFact), getGLBlend(dstAlphaFact));
		} else {
			CacheHandler->setBlendFunc(getGLBlend(srcRGBFact), getGLBlend(dstRGBFact));
		}
	}

	// Polygon Offset
	if (queryFeature(EVDF_POLYGON_OFFSET) && (resetAllRenderStates ||
													 lastmaterial.PolygonOffsetSlopeScale != material.PolygonOffsetSlopeScale ||
													 lastmaterial.PolygonOffsetDepthBias != material.PolygonOffsetDepthBias)) {
		glDisable(lastmaterial.Wireframe ? GL_POLYGON_OFFSET_LINE : lastmaterial.PointCloud ? GL_POLYGON_OFFSET_POINT
																							: GL_POLYGON_OFFSET_FILL);
		if (material.PolygonOffsetSlopeScale || material.PolygonOffsetDepthBias) {
			glEnable(material.Wireframe ? GL_POLYGON_OFFSET_LINE : material.PointCloud ? GL_POLYGON_OFFSET_POINT
																					   : GL_POLYGON_OFFSET_FILL);

			glPolygonOffset(material.PolygonOffsetSlopeScale, material.PolygonOffsetDepthBias);
		} else {
			glPolygonOffset(0.0f, 0.f);
		}
	}

	// thickness
	if (resetAllRenderStates || lastmaterial.Thickness != material.Thickness) {
		if (AntiAlias) {
			//			glPointSize(core::clamp(static_cast<GLfloat>(material.Thickness), DimSmoothedPoint[0], DimSmoothedPoint[1]));
			// we don't use point smoothing
			glPointSize(core::clamp(static_cast<GLfloat>(material.Thickness), DimAliasedPoint[0], DimAliasedPoint[1]));
			glLineWidth(core::clamp(static_cast<GLfloat>(material.Thickness), DimSmoothedLine[0], DimSmoothedLine[1]));
		} else {
			glPointSize(core::clamp(static_cast<GLfloat>(material.Thickness), DimAliasedPoint[0], DimAliasedPoint[1]));
			glLineWidth(core::clamp(static_cast<GLfloat>(material.Thickness), DimAliasedLine[0], DimAliasedLine[1]));
		}
	}

	// Anti aliasing
	if ((resetAllRenderStates || lastmaterial.AntiAliasing != material.AntiAliasing) && FeatureAvailable[IRR_ARB_multisample]) {
		if (material.AntiAliasing & EAAM_ALPHA_TO_COVERAGE)
			glEnable(GL_SAMPLE_ALPHA_TO_COVERAGE_ARB);
		else if (lastmaterial.AntiAliasing & EAAM_ALPHA_TO_COVERAGE)
			glDisable(GL_SAMPLE_ALPHA_TO_COVERAGE_ARB);

		if ((AntiAlias >= 2) && (material.AntiAliasing & (EAAM_SIMPLE | EAAM_QUALITY))) {
			glEnable(GL_MULTISAMPLE_ARB);
#ifdef GL_NV_multisample_filter_hint
			if (FeatureAvailable[IRR_NV_multisample_filter_hint]) {
				if ((material.AntiAliasing & EAAM_QUALITY) == EAAM_QUALITY)
					glHint(GL_MULTISAMPLE_FILTER_HINT_NV, GL_NICEST);
				else
					glHint(GL_MULTISAMPLE_FILTER_HINT_NV, GL_FASTEST);
			}
#endif
		} else
			glDisable(GL_MULTISAMPLE_ARB);
	}

	// Texture parameters
	setTextureRenderStates(material, resetAllRenderStates);

	// set current fixed pipeline state
	FixedPipelineState = tempState;
}